

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::expected_lite::expected<int,char>const&>::operator!=
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::expected_lite::expected<int,char>const&> *this,
          unexpected_type<char> *rhs)

{
  lest *this_00;
  unexpected_type<char> *in_R8;
  allocator<char> local_69;
  expected<int,_char> local_68 [4];
  string local_48;
  bool local_21;
  string *local_20;
  unexpected_type<char> *rhs_local;
  expression_lhs<const_nonstd::expected_lite::expected<int,_char>_&> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (unexpected_type<char> *)this;
  this_local = (expression_lhs<const_nonstd::expected_lite::expected<int,_char>_&> *)
               __return_storage_ptr__;
  local_21 = nonstd::expected_lite::operator!=(*(expected<int,_char> **)this,rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"!=",&local_69);
  to_string<nonstd::expected_lite::expected<int,char>,nonstd::expected_lite::unexpected_type<char>>
            (&local_48,this_00,local_68,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }